

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O2

uint __thiscall ON_SubDMeshFragment::FaceCornerIndex(ON_SubDMeshFragment *this)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0xffffffff;
  if ((((this->m_face != (ON_SubDFace *)0x0) &&
       (uVar1 = this->m_face->m_edge_count, uVar1 == 3 || 4 < uVar1)) &&
      (uVar1 == this->m_face_fragment_count)) &&
     (this->m_face_fragment_index < this->m_face_fragment_count)) {
    uVar3 = 0xffffffff;
    uVar2 = -(uint)((this->m_grid).m_S == (uint *)0x0) | (uint)this->m_face_vertex_index[2] |
            -(uint)((this->m_grid).m_side_segment_count == '\0');
    if (this->m_face_vertex_index[3] < 0xfff1) {
      uVar2 = uVar3;
    }
    if (this->m_face_vertex_index[1] < 0xfff1) {
      uVar2 = uVar3;
    }
    if (this->m_face_vertex_index[0] < 0xfff1) {
      uVar2 = uVar3;
    }
    if (uVar1 <= this->m_face_vertex_index[2]) {
      uVar2 = uVar3;
    }
  }
  return uVar2;
}

Assistant:

unsigned int ON_SubDMeshFragment::FaceCornerIndex() const
{
  return (
    nullptr != m_face
    && (3 == m_face->m_edge_count || m_face->m_edge_count >= 5)
    && m_face->m_edge_count == m_face_fragment_count
    && m_face_fragment_index < m_face_fragment_count
    && m_face_vertex_index[2] < m_face->m_edge_count
    && m_face_vertex_index[0] > ON_SubDFace::MaximumEdgeCount
    && m_face_vertex_index[1] > ON_SubDFace::MaximumEdgeCount
    && m_face_vertex_index[3] > ON_SubDFace::MaximumEdgeCount
    && m_grid.m_side_segment_count > 0 && nullptr != m_grid.m_S
    )
    ? ((unsigned int)m_face_vertex_index[2])
    : ON_UNSET_UINT_INDEX
    ;
}